

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall mjs::parser::check_literal(parser *this)

{
  bool bVar1;
  wchar_t *in_R9;
  wstring_view s;
  wstring_view message;
  bool local_239;
  source_extend local_230;
  wstring local_218 [32];
  undefined1 local_1f8 [16];
  source_extend local_1e8;
  wostringstream local_1d0 [8];
  wostringstream _oss;
  source_extend local_40;
  wstring_view local_28;
  token_type local_14;
  parser *ppStack_10;
  token_type tt;
  parser *this_local;
  
  ppStack_10 = this;
  local_14 = current_token_type(this);
  bVar1 = is_literal(local_14);
  if (!bVar1) {
    __assert_fail("is_literal(tt)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x1a7,"void mjs::parser::check_literal()");
  }
  if ((this->strict_mode_ & 1U) != 0) {
    local_239 = false;
    if (local_14 == numeric_literal) {
      current_extend(&local_40,this);
      local_28 = source_extend::source_view(&local_40);
      s._M_str = local_28._M_str;
      s._M_len = (size_t)s._M_str;
      local_239 = is_octal_literal((mjs *)local_28._M_len,s);
      source_extend::~source_extend(&local_40);
    }
    if (local_239 != false) {
      std::__cxx11::wostringstream::wostringstream(local_1d0);
      std::operator<<((wostream *)local_1d0,"Octal literals may not be used in strict mode");
      current_extend(&local_1e8,this);
      std::__cxx11::wostringstream::str();
      local_1f8 = std::__cxx11::wstring::operator_cast_to_basic_string_view(local_218);
      message._M_str = in_R9;
      message._M_len = local_1f8._8_8_;
      syntax_error((parser *)"check_literal",(char *)0x1ac,(int)&local_1e8,local_1f8._0_8_,message);
    }
    if (local_14 == string_literal) {
      current_extend(&local_230,this);
      check_string_literal(this,&local_230);
      source_extend::~source_extend(&local_230);
    }
  }
  return;
}

Assistant:

void check_literal() {
        const auto tt = current_token_type();
        assert(is_literal(tt));
        if (!strict_mode_) {
            return;
        }
        if (tt == token_type::numeric_literal && is_octal_literal(current_extend().source_view())) {
            SYNTAX_ERROR("Octal literals may not be used in strict mode");
        } else if (tt == token_type::string_literal) {
            check_string_literal(current_extend());
        }
    }